

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

sexp_conflict
sexp_flexpt_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                sexp_conflict arg1)

{
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0xb)) {
    if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xb)) {
      pow(*(double *)(in_RCX + 2),*(double *)(in_R8 + 2));
      local_8 = (sexp_conflict)sexp_make_flonum(in_RDI);
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0xb,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0xb,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_flexpt_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  if (! sexp_flonump(arg1))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg1);
  res = sexp_make_flonum(ctx, pow(sexp_flonum_value(arg0), sexp_flonum_value(arg1)));
  return res;
}